

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

int CVmObjList::getp_splice(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  long lVar1;
  ushort uVar2;
  CVmObjPageEntry *pCVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  vm_obj_id_t vVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong local_50;
  
  if (in_argc == (uint *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = (ulong)*in_argc;
  }
  if (getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_splice();
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_splice::desc);
  if (iVar7 == 0) {
    uVar2 = *(ushort *)lst;
    iVar8 = CVmBif::pop_int_val();
    iVar9 = CVmBif::pop_int_val();
    pvVar6 = sp_;
    iVar7 = uVar2 + 1;
    if (0 < iVar8) {
      iVar7 = 0;
    }
    uVar13 = (iVar7 + iVar8) - 1;
    uVar14 = (ulong)uVar13;
    if ((int)(uint)uVar2 <= (int)uVar13) {
      uVar14 = (ulong)uVar2;
    }
    uVar13 = 0;
    if (0 < iVar7 + iVar8) {
      uVar13 = (uint)uVar14;
    }
    iVar7 = uVar2 - uVar13;
    if (iVar9 < iVar7) {
      iVar7 = iVar9;
    }
    if (iVar9 < 0) {
      iVar7 = 0;
    }
    uVar16 = (uint)local_50;
    if (iVar7 == 0 && uVar16 - 2 == 0) {
      uVar5 = *(undefined4 *)&self_val->field_0x4;
      aVar4 = self_val->val;
      retval->typ = self_val->typ;
      *(undefined4 *)&retval->field_0x4 = uVar5;
      retval->val = aVar4;
    }
    else {
      uVar5 = *(undefined4 *)&self_val->field_0x4;
      aVar4 = self_val->val;
      sp_ = sp_ + 1;
      pvVar6->typ = self_val->typ;
      *(undefined4 *)&pvVar6->field_0x4 = uVar5;
      pvVar6->val = aVar4;
      vVar10 = create(0,(long)(int)(((uVar16 - 2) + (uint)uVar2) - iVar7));
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar10;
      pvVar6 = sp_;
      uVar11 = vVar10 & 0xfff;
      pCVar3 = G_obj_table_X.pages_[vVar10 >> 0xc];
      uVar5 = *(undefined4 *)&retval->field_0x4;
      aVar4 = retval->val;
      sp_ = sp_ + 1;
      pvVar6->typ = retval->typ;
      *(undefined4 *)&pvVar6->field_0x4 = uVar5;
      pvVar6->val = aVar4;
      uVar12 = 0;
      if (0 < (int)uVar13) {
        memcpy((void *)(*(long *)((long)&pCVar3->ptr_ + (ulong)(uVar11 * 0x18) + 8) + 2),lst + 2,
               (ulong)uVar13 * 5);
        uVar12 = uVar14;
      }
      if (2 < uVar16) {
        lVar15 = uVar12 * 5 + 2;
        uVar12 = (ulong)(((int)uVar12 + uVar16) - 2);
        lVar17 = -0x30;
        do {
          vmb_put_dh((char *)(*(long *)((long)&pCVar3->ptr_ + (ulong)(uVar11 * 0x18) + 8) + lVar15),
                     (vm_val_t *)((long)&sp_->typ + lVar17));
          lVar15 = lVar15 + 5;
          lVar1 = local_50 * 0x10 + lVar17;
          lVar17 = lVar17 + -0x10;
        } while (lVar1 != 0);
      }
      iVar7 = iVar7 + uVar13;
      if (iVar7 < (int)(uint)uVar2) {
        memcpy((void *)(*(long *)((long)&pCVar3->ptr_ + (ulong)(uVar11 * 0x18) + 8) + uVar12 * 5 + 2
                       ),lst + (long)iVar7 * 5 + 2,((ulong)uVar2 - (long)iVar7) * 5);
      }
      sp_ = sp_ + -(long)(int)uVar16;
    }
  }
  return 1;
}

Assistant:

int CVmObjList::getp_splice(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* remember the length of my list */
    int lst_cnt = vmb_get_len(lst);

    /* retrieve the starting index and deletion length arguments */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    int del_cnt = CVmBif::pop_int_val(vmg0_);

    /* a negative starting index counts from the end of the list */
    if (start_idx <= 0)
        start_idx += lst_cnt + 1;

    /* adjust to zero-based indexing */
    --start_idx;

    /* make sure the values are in range */
    start_idx = (start_idx < 0 ? 0 :
                 start_idx > lst_cnt ? lst_cnt :
                 start_idx);
    del_cnt = (del_cnt < 0 ? 0 :
               del_cnt > lst_cnt - start_idx ? lst_cnt - start_idx :
               del_cnt);

    /* figure the insertion size: each argument is a value to insert */
    int ins_cnt = argc - 2;

    /* if we're making any changes, build the new list */
    if (del_cnt != 0 || ins_cnt != 0)
    {
        /* put myself on the stack for GC protection */
        G_stk->push(self_val);

        /* create a list to store the return value */
        retval->set_obj(create(vmg_ FALSE, lst_cnt + ins_cnt - del_cnt));
        CVmObjList *new_lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

        /* push a reference to the new list for gc protection */
        G_stk->push(retval);
        
        /* copy elements from the original up to the starting index */
        int dst = 0;
        if (start_idx > 0)
        {
            new_lst->cons_copy_data(0, lst + VMB_LEN, start_idx);
            dst = start_idx;
        }
        
        /* 
         *   Add the inserted items from the arguments.  We popped our first
         *   two arguments, but then we pushed two items for gc protection,
         *   so conveniently the inserted items are just args 2..argc-1 
         */
        for (uint i = 2 ; i < argc ; ++i)
            new_lst->cons_set_element(dst++, G_stk->get(i));
        
        /* copy the remaining elements after the deleted segment, if any */
        if (lst_cnt > start_idx + del_cnt)
        {
            new_lst->cons_copy_data(
                dst, get_element_ptr_const(lst, start_idx + del_cnt),
                lst_cnt - (start_idx + del_cnt));
        }   
        
        /* 
         *   Discard the gc protection and insertion arguments.  We added two
         *   elements for gc protection, and popped two arguments, so the net
         *   is the original argument count.  
         */
        G_stk->discard(argc);
    }
    else
    {
        /* 
         *   There's nothing to do - just return the original list.  (There's
         *   nothing to discard from the stack: we have no more arguments,
         *   since ins_cnt is zero, and we haven't pushed any gc protection
         *   elements.) 
         */
        *retval = *self_val;
    }

    /* handled */
    return TRUE;
}